

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O1

void * tabosc4_tilde_new(t_symbol *s)

{
  t_object *owner;
  t_symbol *ptVar1;
  
  owner = (t_object *)pd_new(tabosc4_tilde_class);
  owner[1].te_binbuf = (_binbuf *)s;
  owner[1].te_g.g_next = (_gobj *)0x0;
  owner[1].te_g.g_pd = (t_pd)0x3b00000044000000;
  ptVar1 = gensym("signal");
  outlet_new(owner,ptVar1);
  ptVar1 = gensym("ft1");
  inlet_new(owner,(t_pd *)owner,&s_float,ptVar1);
  *(undefined4 *)&owner[1].te_outlet = 0;
  return owner;
}

Assistant:

static void *tabosc4_tilde_new(t_symbol *s)
{
    t_tabosc4_tilde *x = (t_tabosc4_tilde *)pd_new(tabosc4_tilde_class);
    x->x_arrayname = s;
    x->x_vec = 0;
    x->x_fnpoints = 512.;
    x->x_finvnpoints = (1./512.);
    outlet_new(&x->x_obj, gensym("signal"));
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_float, gensym("ft1"));
    x->x_f = 0;
    return (x);
}